

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar * u_memrchr_63(UChar *s,UChar c,int32_t count)

{
  UChar *pUVar1;
  long lVar2;
  UChar local_2;
  
  if (count < 1) {
    pUVar1 = (UChar *)0x0;
  }
  else if ((c & 0xf800U) == 0xd800) {
    pUVar1 = u_strFindLast_63(s,count,&local_2,1);
  }
  else {
    lVar2 = (ulong)(uint)count * 2;
    pUVar1 = (UChar *)0x0;
    do {
      if (*(UChar *)((long)s + lVar2 + -2) == c) {
        return (UChar *)((long)s + lVar2 + -2);
      }
      lVar2 = lVar2 + -2;
    } while (lVar2 != 0);
  }
  return pUVar1;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memrchr(const UChar *s, UChar c, int32_t count) {
    if(count<=0) {
        return NULL; /* no string */
    } else if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindLast(s, count, &c, 1);
    } else {
        /* trivial search for a BMP code point */
        const UChar *limit=s+count;
        do {
            if(*(--limit)==c) {
                return (UChar *)limit;
            }
        } while(s!=limit);
        return NULL;
    }
}